

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
* toml::detail::parse_array_table_key<toml::type_config>
            (location *loc,context<toml::type_config> *ctx)

{
  bool bVar1;
  context<toml::type_config> *in_RDX;
  result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
  *in_RDI;
  context<toml::type_config> *in_stack_00000110;
  location *in_stack_00000118;
  result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
  keys_res;
  region reg;
  spec *spec;
  location first;
  location *in_stack_fffffffffffffb48;
  result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
  *in_stack_fffffffffffffb50;
  size_t in_stack_fffffffffffffb58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  location *in_stack_fffffffffffffb60;
  location *in_stack_fffffffffffffb68;
  location *in_stack_fffffffffffffb70;
  allocator<char> *in_stack_fffffffffffffb80;
  char *in_stack_fffffffffffffb88;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
  *in_stack_fffffffffffffba8;
  source_location in_stack_fffffffffffffbb0;
  pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>
  *in_stack_fffffffffffffbd8;
  context<toml::type_config> *in_stack_fffffffffffffbe8;
  location *in_stack_fffffffffffffbf0;
  spec *in_stack_fffffffffffffbf8;
  undefined8 in_stack_fffffffffffffc40;
  undefined8 in_stack_fffffffffffffc48;
  result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
  local_2f0;
  undefined4 local_268;
  allocator<char> local_261;
  string *in_stack_fffffffffffffda0;
  location *in_stack_fffffffffffffda8;
  sequence *in_stack_fffffffffffffdb0;
  string *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d1 [11];
  spec *local_68;
  context<toml::type_config> *local_18;
  
  local_18 = in_RDX;
  location::location(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
  local_68 = context<toml::type_config>::toml_spec(local_18);
  syntax::array_table(in_stack_fffffffffffffbf8);
  sequence::scan((sequence *)in_stack_fffffffffffffc48,(location *)in_stack_fffffffffffffc40);
  sequence::~sequence((sequence *)in_stack_fffffffffffffb50);
  bVar1 = region::is_ok((region *)0x64f296);
  if (bVar1) {
    location::operator=((location *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
    location::advance(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
    location::advance(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
    skip_whitespace<toml::type_config>(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    parse_key<toml::type_config>(in_stack_00000118,in_stack_00000110);
    bVar1 = result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
            ::is_err(&local_2f0);
    if (bVar1) {
      result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
      ::unwrap_err(in_stack_fffffffffffffba8,in_stack_fffffffffffffbb0);
      err<toml::error_info>((error_info *)in_stack_fffffffffffffba8);
      result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
      ::result(in_stack_fffffffffffffb50,(failure_type *)in_stack_fffffffffffffb48);
      failure<toml::error_info>::~failure((failure<toml::error_info> *)0x64f61b);
    }
    else {
      skip_whitespace<toml::type_config>(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
      __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x1;
      location::advance(in_stack_fffffffffffffb60,1);
      location::advance(in_stack_fffffffffffffb60,(size_t)__x);
      result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
      ::unwrap((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
                *)&PTR_s__workspace_llm4binary_github_lic_0093b520,in_stack_fffffffffffffbb0);
      std::
      make_pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,toml::detail::region>
                (__x,(region *)in_stack_fffffffffffffb50);
      in_stack_fffffffffffffb50 =
           (result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
            *)&stack0xfffffffffffffc30;
      ok<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,toml::detail::region>>
                (in_stack_fffffffffffffbd8);
      result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
      ::result(in_stack_fffffffffffffb50,(success_type *)in_stack_fffffffffffffb48);
      success<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>_>
      ::~success((success<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>_>
                  *)0x64f736);
      std::
      pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>
      ::~pair((pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>
               *)in_stack_fffffffffffffb50);
    }
    local_268 = 1;
    result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
    ::~result((result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
               *)0x64f787);
  }
  else {
    this = local_1d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
    syntax::array_table(in_stack_fffffffffffffbf8);
    location::location(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    __s = &local_261;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,in_stack_fffffffffffffb80);
    make_syntax_error<toml::detail::sequence>
              (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
               in_stack_fffffffffffffda0);
    err<toml::error_info>((error_info *)in_stack_fffffffffffffba8);
    result<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::error_info>
    ::result(in_stack_fffffffffffffb50,(failure_type *)in_stack_fffffffffffffb48);
    failure<toml::error_info>::~failure((failure<toml::error_info> *)0x64f38d);
    error_info::~error_info((error_info *)in_stack_fffffffffffffb50);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb50);
    std::allocator<char>::~allocator(&local_261);
    location::~location((location *)in_stack_fffffffffffffb50);
    sequence::~sequence((sequence *)in_stack_fffffffffffffb50);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb50);
    std::allocator<char>::~allocator((allocator<char> *)local_1d1);
    local_268 = 1;
  }
  region::~region((region *)in_stack_fffffffffffffb50);
  location::~location((location *)in_stack_fffffffffffffb50);
  return in_RDI;
}

Assistant:

result<std::pair<std::vector<typename basic_value<TC>::key_type>, region>, error_info>
parse_array_table_key(location& loc, context<TC>& ctx)
{
    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    auto reg = syntax::array_table(spec).scan(loc);
    if(!reg.is_ok())
    {
        return err(make_syntax_error("toml::parse_array_table_key: invalid array-of-tables key",
            syntax::array_table(spec), loc));
    }

    loc = first;
    loc.advance(); // [
    loc.advance(); // [
    skip_whitespace(loc, ctx);

    auto keys_res = parse_key(loc, ctx);
    if(keys_res.is_err())
    {
        return err(std::move(keys_res.unwrap_err()));
    }

    skip_whitespace(loc, ctx);
    loc.advance(); // ]
    loc.advance(); // ]

    return ok(std::make_pair(std::move(keys_res.unwrap().first), std::move(reg)));
}